

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

bool __thiscall flow::IRHandler::isAfter(IRHandler *this,BasicBlock *bb,BasicBlock *afterThat)

{
  uint __line;
  _List_node_base *p_Var1;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar2;
  char *__assertion;
  bool bVar3;
  
  if (bb->handler_ == this) {
    if (afterThat->handler_ == this) {
      plVar2 = &this->blocks_;
      p_Var1 = (_List_node_base *)plVar2;
      do {
        p_Var1 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                    *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var1 == (_List_node_base *)plVar2) goto LAB_0014478d;
      } while ((BasicBlock *)p_Var1[1]._M_next != bb);
      if (p_Var1->_M_next == (_List_node_base *)plVar2) {
LAB_0014478d:
        bVar3 = false;
      }
      else {
        bVar3 = (BasicBlock *)p_Var1->_M_next[1]._M_next == afterThat;
      }
      return bVar3;
    }
    __assertion = "afterThat->getHandler() == this";
    __line = 0x49;
  }
  else {
    __assertion = "bb->getHandler() == this";
    __line = 0x48;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                ,__line,
                "bool flow::IRHandler::isAfter(const BasicBlock *, const BasicBlock *) const");
}

Assistant:

bool IRHandler::isAfter(const BasicBlock* bb, const BasicBlock* afterThat) const {
  assert(bb->getHandler() == this);
  assert(afterThat->getHandler() == this);

  auto i = std::find_if(blocks_.cbegin(), blocks_.cend(),
                       [&](const auto& obj) { return obj.get() == bb; });

  if (i == blocks_.cend())
    return false;

  ++i;

  if (i == blocks_.cend())
    return false;

  return i->get() == afterThat;
}